

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseJacocoCoverage.cxx
# Opt level: O3

void __thiscall cmParseJacocoCoverage::XMLParser::~XMLParser(XMLParser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_cmXMLParser)._vptr_cmXMLParser = (_func_int **)&PTR__XMLParser_006b5820;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->FilePaths);
  pcVar2 = (this->CurFileName)._M_dataplus._M_p;
  paVar1 = &(this->CurFileName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->ModuleName)._M_dataplus._M_p;
  paVar1 = &(this->ModuleName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->FileName)._M_dataplus._M_p;
  paVar1 = &(this->FileName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->PackageName)._M_dataplus._M_p;
  paVar1 = &(this->PackageName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  cmXMLParser::~cmXMLParser(&this->super_cmXMLParser);
  return;
}

Assistant:

virtual ~XMLParser()
      {
      }